

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_do_button_text_symbol
                  (nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_symbol_type symbol,
                  char *str,int len,nk_flags align,nk_button_behavior behavior,
                  nk_style_button *style,nk_user_font *font,nk_input *in)

{
  nk_rect r;
  nk_command_buffer *in_RCX;
  char *in_RSI;
  int in_EDI;
  undefined4 in_R8D;
  uint in_R9D;
  float fVar1;
  undefined8 in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  long in_stack_00000010;
  long in_stack_00000018;
  nk_rect content;
  nk_rect tri;
  int ret;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  nk_button_behavior in_stack_ffffffffffffff7c;
  nk_input *in_stack_ffffffffffffff80;
  nk_style_button *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float local_60;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  float fVar2;
  float in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  nk_symbol_type in_stack_ffffffffffffffe0;
  undefined4 uVar4;
  nk_bool local_c;
  
  uVar4 = (undefined4)((ulong)in_XMM0_Qa >> 0x20);
  memset(&stack0xffffffffffffffa4,0,0x10);
  if (((in_RSI == (char *)0x0) || (in_stack_00000010 == 0)) || (in_stack_00000018 == 0)) {
    local_c = 0;
  }
  else {
    r.y = (float)in_stack_ffffffffffffffa8;
    r.x = (float)in_stack_ffffffffffffffa4;
    r.w = (float)in_stack_ffffffffffffffac;
    r.h = in_stack_ffffffffffffffb0;
    local_c = nk_do_button((nk_flags *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                           ,(nk_command_buffer *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),r,
                           in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff7c,
                           (nk_rect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
    ;
    fVar1 = (in_stack_ffffffffffffff98 + local_60 / 2.0) - *(float *)(in_stack_00000018 + 8) / 2.0;
    fVar2 = *(float *)(in_stack_00000018 + 8);
    uVar3 = *(undefined4 *)(in_stack_00000018 + 8);
    if ((in_R9D & 1) == 0) {
      in_stack_ffffffffffffff94 =
           *(float *)(in_stack_00000010 + 0x80) + *(float *)(in_stack_00000010 + 0x80) +
           in_stack_ffffffffffffff94;
    }
    else {
      in_stack_ffffffffffffff94 =
           (in_stack_ffffffffffffff94 + in_stack_ffffffffffffff9c) -
           (*(float *)(in_stack_00000010 + 0x80) + *(float *)(in_stack_00000010 + 0x80) + fVar2);
      if (in_stack_ffffffffffffff94 < 0.0) {
        in_stack_ffffffffffffff94 = 0.0;
      }
    }
    if (*(long *)(in_stack_00000010 + 0xa0) != 0) {
      (**(code **)(in_stack_00000010 + 0xa0))(in_RSI,*(undefined8 *)(in_stack_00000010 + 0x98));
    }
    nk_draw_button_text_symbol
              (in_RCX,(nk_rect *)CONCAT44(in_R8D,in_R9D),(nk_rect *)CONCAT44(local_c,uVar3),
               (nk_rect *)CONCAT44(fVar2,fVar1),(nk_flags)in_stack_ffffffffffffff94,
               (nk_style_button *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_RSI,in_EDI,in_stack_ffffffffffffffe0,(nk_user_font *)CONCAT44(in_XMM1_Da,uVar4));
    if (*(long *)(in_stack_00000010 + 0xa8) != 0) {
      (**(code **)(in_stack_00000010 + 0xa8))(in_RSI,*(undefined8 *)(in_stack_00000010 + 0x98));
    }
  }
  return local_c;
}

Assistant:

NK_LIB nk_bool
nk_do_button_text_symbol(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect bounds,
enum nk_symbol_type symbol, const char *str, int len, nk_flags align,
enum nk_button_behavior behavior, const struct nk_style_button *style,
const struct nk_user_font *font, const struct nk_input *in)
{
int ret;
struct nk_rect tri = {0,0,0,0};
struct nk_rect content;

NK_ASSERT(style);
NK_ASSERT(out);
NK_ASSERT(font);
if (!out || !style || !font)
return nk_false;

ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
tri.y = content.y + (content.h/2) - font->height/2;
tri.w = font->height; tri.h = font->height;
if (align & NK_TEXT_ALIGN_LEFT) {
tri.x = (content.x + content.w) - (2 * style->padding.x + tri.w);
tri.x = NK_MAX(tri.x, 0);
} else tri.x = content.x + 2 * style->padding.x;

/* draw button */
if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_button_text_symbol(out, &bounds, &content, &tri,
*state, style, str, len, symbol, font);
if (style->draw_end) style->draw_end(out, style->userdata);
return ret;
}